

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O1

void __thiscall Simplex::printU(Simplex *this)

{
  vec<IndexVal> *pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  fwrite("U:\n",3,1,_stderr);
  if (0 < this->m) {
    uVar4 = 0;
    do {
      if ((this->U_rows).data[uVar4].sz != 0) {
        fprintf(_stderr,"row %d: ",uVar4 & 0xffffffff);
      }
      pvVar1 = (this->U_rows).data;
      if (pvVar1[uVar4].sz != 0) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          fprintf(_stderr,"%d:%.3Lf ",
                  (ulong)*(uint *)((long)&(pvVar1[uVar4].data)->field_0 + lVar2 + 0xc));
          uVar3 = uVar3 + 1;
          pvVar1 = (this->U_rows).data;
          lVar2 = lVar2 + 0x10;
        } while (uVar3 < pvVar1[uVar4].sz);
        if (pvVar1[uVar4].sz != 0) {
          fputc(10,_stderr);
        }
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)this->m);
  }
  if (0 < this->m) {
    uVar4 = 0;
    do {
      if ((this->U_cols).data[uVar4].sz != 0) {
        fprintf(_stderr,"col %d: ",uVar4 & 0xffffffff);
      }
      pvVar1 = (this->U_cols).data;
      if (pvVar1[uVar4].sz != 0) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          fprintf(_stderr,"%d:%.3Lf ",
                  (ulong)*(uint *)((long)&(pvVar1[uVar4].data)->field_0 + lVar2 + 0xc));
          uVar3 = uVar3 + 1;
          pvVar1 = (this->U_cols).data;
          lVar2 = lVar2 + 0x10;
        } while (uVar3 < pvVar1[uVar4].sz);
        if (pvVar1[uVar4].sz != 0) {
          fputc(10,_stderr);
        }
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)this->m);
  }
  fwrite("diag: ",6,1,_stderr);
  if (0 < this->m) {
    uVar4 = 0;
    do {
      fprintf(_stderr,"%d:%.3Lf ",uVar4 & 0xffffffff);
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)this->m);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void Simplex::printU() {
	fprintf(stderr, "U:\n");
	for (int i = 0; i < m; i++) {
		if (U_rows[i].size() != 0) {
			fprintf(stderr, "row %d: ", i);
		}
		for (unsigned int j = 0; j < U_rows[i].size(); j++) {
			fprintf(stderr, "%d:%.3Lf ", U_rows[i][j].index(), U_rows[i][j].val());
		}
		if (U_rows[i].size() != 0) {
			fprintf(stderr, "\n");
		}
	}
	for (int i = 0; i < m; i++) {
		if (U_cols[i].size() != 0) {
			fprintf(stderr, "col %d: ", i);
		}
		for (unsigned int j = 0; j < U_cols[i].size(); j++) {
			fprintf(stderr, "%d:%.3Lf ", U_cols[i][j].index(), U_cols[i][j].val());
		}
		if (U_cols[i].size() != 0) {
			fprintf(stderr, "\n");
		}
	}
	fprintf(stderr, "diag: ");
	for (int i = 0; i < m; i++) {
		fprintf(stderr, "%d:%.3Lf ", i, U_diag[i]);
	}
	fprintf(stderr, "\n");
}